

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O3

void remove_always_return_values(ListNode *map_head,size_t number_of_symbol_names)

{
  ListNode *pLVar1;
  void *pvVar2;
  ListNode *pLVar3;
  ListNode *pLVar4;
  ListNode *__ptr;
  code *cleanup_value_data;
  
  if (map_head == (ListNode *)0x0) {
    cm_print_error("%s\n","map_head");
    _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
          ,0x35f);
  }
  if (number_of_symbol_names != 0) {
    pLVar3 = map_head->next;
    cleanup_value_data = (code *)number_of_symbol_names;
    while( true ) {
      __ptr = pLVar3;
      if (__ptr == map_head) {
        return;
      }
      pvVar2 = __ptr->value;
      if (pvVar2 == (void *)0x0) break;
      pLVar3 = __ptr->next;
      pLVar1 = (ListNode *)((long)pvVar2 + 8);
      pLVar4 = *(ListNode **)((long)pvVar2 + 0x18);
      if (pLVar4 != pLVar1) {
        if (number_of_symbol_names == 1) {
          if (pLVar4->refcount < -1) {
            cleanup_value_data = free_value;
            list_remove_free(pLVar4,free_value,(void *)0x0);
          }
        }
        else {
          cleanup_value_data = (code *)0x1;
          remove_always_return_values(pLVar1,1);
        }
      }
      if (*(ListNode **)((long)pvVar2 + 0x18) == pLVar1) {
        pLVar1 = __ptr->next;
        pLVar4 = __ptr->prev;
        pLVar4->next = pLVar1;
        pLVar1->prev = pLVar4;
        free_value(__ptr->value,cleanup_value_data);
        free(__ptr);
      }
    }
    cm_print_error("%s\n","value");
    _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
          ,0x366);
  }
  cm_print_error("%s\n","number_of_symbol_names");
  _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O3/_deps/cmocka-src/src/cmocka.c"
        ,0x360);
}

Assistant:

static void remove_always_return_values(ListNode * const map_head,
                                        const size_t number_of_symbol_names) {
    ListNode *current;
    assert_non_null(map_head);
    assert_true(number_of_symbol_names);
    current = map_head->next;
    while (current != map_head) {
        SymbolMapValue * const value = (SymbolMapValue*)current->value;
        ListNode * const next = current->next;
        ListNode *child_list;
        assert_non_null(value);
        child_list = &value->symbol_values_list_head;

        if (!list_empty(child_list)) {
            if (number_of_symbol_names == 1) {
                ListNode * const child_node = child_list->next;
                /* If this item has been returned more than once, free it. */
                if (child_node->refcount < -1) {
                    list_remove_free(child_node, free_value, NULL);
                }
            } else {
                remove_always_return_values(child_list,
                                            number_of_symbol_names - 1);
            }
        }

        if (list_empty(child_list)) {
            list_remove_free(current, free_value, NULL);
        }
        current = next;
    }
}